

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O1

int Sto_ManChangeLastClause(Sto_Man_t *p)

{
  Sto_Cls_t *pSVar1;
  Sto_Cls_t *pSVar2;
  Sto_Cls_t *pSVar3;
  
  pSVar2 = (Sto_Cls_t *)&p->pHead;
  pSVar1 = (Sto_Cls_t *)0x0;
  do {
    pSVar3 = pSVar1;
    pSVar2 = pSVar2->pNext;
    pSVar1 = pSVar2;
  } while (pSVar2 != (Sto_Cls_t *)0x0);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("pPrev != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satStore.c"
                  ,0x11d,"int Sto_ManChangeLastClause(Sto_Man_t *)");
  }
  if ((*(uint *)&pSVar3->field_0x1c & 1) == 0) {
    __assert_fail("pPrev->fA == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satStore.c"
                  ,0x11e,"int Sto_ManChangeLastClause(Sto_Man_t *)");
  }
  if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff8) == 8) {
    p->nClausesA = p->nClausesA + -1;
    pSVar3->field_0x1c = pSVar3->field_0x1c & 0xfe;
    return *(int *)&pSVar3[1].pNext >> 1;
  }
  __assert_fail("pPrev->nLits == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satStore.c"
                ,0x11f,"int Sto_ManChangeLastClause(Sto_Man_t *)");
}

Assistant:

int Sto_ManChangeLastClause( Sto_Man_t * p )
{
    Sto_Cls_t * pClause, * pPrev;
    pPrev = NULL;
    Sto_ManForEachClause( p, pClause )
        pPrev = pClause;
    assert( pPrev != NULL );
    assert( pPrev->fA == 1 );
    assert( pPrev->nLits == 1 );
    p->nClausesA--;
    pPrev->fA = 0;
    return pPrev->pLits[0] >> 1;
}